

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O2

void __thiscall Cli::App::debug(App *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  _Base_ptr p_Var4;
  int i;
  ulong uVar5;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Arguments : ");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->args,uVar5);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)pvVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Options : ");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (p_Var4 = (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->options)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var4 + 2),"");
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)(p_Var4 + 1));
    if (bVar1) {
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 2));
    }
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Flags : ");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->flags).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->flags).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->flags,uVar5);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)pvVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void App::debug(){
        std::cerr << "Arguments : " << std::endl;
        for(int i = 0 ; i< args.size(); i++){
            std::cerr << args.at(i) << std::endl;
        }


        std::cerr << "Options : " << std::endl;
        std::map<std::string, std::string>::iterator pos;
        for (pos = options.begin(); pos != options.end(); ++pos) {
            if(pos->second != "")
                std::cerr << pos->first << " = " << pos->second << std::endl;
            else
                std::cerr << pos->first << std::endl;

        }

        std::cerr << "Flags : " << std::endl;
        for(int i = 0 ; i< flags.size(); i++){
            std::cerr << flags.at(i) << std::endl;
        }
    }